

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O2

void sweep2old(lua_State *L,GCObject **p)

{
  global_State *pgVar1;
  GCObject *o;
  byte bVar2;
  
  pgVar1 = L->l_G;
  do {
    while( true ) {
      while( true ) {
        o = ((GCObject *)p)->next;
        if (o == (GCObject *)0x0) {
          return;
        }
        if ((o->marked & 0x18) == 0) break;
        ((GCObject *)p)->next = o->next;
        freeobj(L,o);
      }
      bVar2 = o->marked & 0xe0;
      p = &o->next;
      if (o->tt != '\t') break;
      if (o[1].next == (GCObject *)&o[1].tt) goto LAB_0012838f;
LAB_00128384:
      o->marked = bVar2 + 4 & 0xc4;
    }
    if (o->tt == '\b') {
      *(GCObject **)&o[4].tt = pgVar1->grayagain;
      pgVar1->grayagain = o;
      goto LAB_00128384;
    }
LAB_0012838f:
    o->marked = bVar2 | 0x24;
  } while( true );
}

Assistant:

static void sweep2old (lua_State *L, GCObject **p) {
  GCObject *curr;
  global_State *g = G(L);
  while ((curr = *p) != NULL) {
    if (iswhite(curr)) {  /* is 'curr' dead? */
      lua_assert(isdead(g, curr));
      *p = curr->next;  /* remove 'curr' from list */
      freeobj(L, curr);  /* erase 'curr' */
    }
    else {  /* all surviving objects become old */
      setage(curr, G_OLD);
      if (curr->tt == LUA_VTHREAD) {  /* threads must be watched */
        lua_State *th = gco2th(curr);
        linkgclist(th, g->grayagain);  /* insert into 'grayagain' list */
      }
      else if (curr->tt == LUA_VUPVAL && upisopen(gco2upv(curr)))
        set2gray(curr);  /* open upvalues are always gray */
      else  /* everything else is black */
        nw2black(curr);
      p = &curr->next;  /* go to next element */
    }
  }
}